

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
             *this,char **it)

{
  size_t sVar1;
  char *pcVar2;
  char **it_local;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *this_local;
  
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)this);
  if (sVar1 != 0) {
    pcVar2 = basic_string_view<char>::data((basic_string_view<char> *)this);
    sVar1 = basic_string_view<char>::size((basic_string_view<char> *)this);
    pcVar2 = std::copy_n<char_const*,unsigned_long,char*>(pcVar2,sVar1,*it);
    *it = pcVar2;
  }
  pcVar2 = std::fill_n<char*,unsigned_long,char>
                     (*it,*(unsigned_long *)(this + 0x18),(char *)(this + 0x10));
  *it = pcVar2;
  int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            ((num_writer *)(this + 0x20),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = std::copy_n(prefix.data(), prefix.size(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }